

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O2

void __thiscall
chrono::utils::Generator::createObjects(Generator *this,PointVector *points,ChVector<double> *vel)

{
  ChBodyFrame *this_00;
  element_type *peVar1;
  MixtureIngredient *pMVar2;
  pointer pCVar3;
  ChSystem *pCVar4;
  long *plVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ChBody *this_01;
  element_type *peVar13;
  ulong __n;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_02;
  reference rVar14;
  shared_ptr<chrono::ChBody> bodyPtr;
  shared_ptr<chrono::ChMaterialSurface> mat;
  ChVector<double> size;
  shared_ptr<chrono::ChMaterialSurfaceSMC> matSMC;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_208 [2];
  PointVector *local_1f8;
  long local_1f0;
  double local_1e8;
  double local_1e0;
  vector<chrono::utils::Generator::BodyInfo,_std::allocator<chrono::utils::Generator::BodyInfo>_>
  *local_1d8;
  ChVector<double> *local_1d0;
  element_type *local_1c8;
  ulong local_1c0;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_1b8;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_1a8;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_198;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_178;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_168;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_158;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_148;
  double volume;
  vector<bool,_std::allocator<bool>_> flags;
  ChVector<double> gyration;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_e0;
  shared_ptr<chrono::ChVisualMaterial> local_d0;
  shared_ptr<chrono::ChVisualMaterial> local_c0;
  shared_ptr<chrono::ChVisualMaterial> local_b0;
  shared_ptr<chrono::ChVisualMaterial> local_a0;
  shared_ptr<chrono::ChVisualMaterial> local_90;
  shared_ptr<chrono::ChVisualMaterial> local_80;
  shared_ptr<chrono::ChVisualMaterial> local_70;
  shared_ptr<chrono::ChVisualMaterial> local_60;
  __shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2> local_40;
  undefined4 extraout_var;
  
  flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_1c8 = (this->m_callback).
              super___shared_ptr<chrono::utils::Generator::CreateObjectsCallback,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  local_1d0 = vel;
  if (local_1c8 != (element_type *)0x0) {
    std::vector<bool,_std::allocator<bool>_>::resize
              (&flags,((long)(points->
                             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(points->
                            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                            )._M_impl.super__Vector_impl_data._M_start) / 0x18,true);
    peVar1 = (this->m_callback).
             super___shared_ptr<chrono::utils::Generator::CreateObjectsCallback,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (**(code **)(*(long *)peVar1 + 0x10))(peVar1,points,&flags);
  }
  local_1d8 = &this->m_bodies;
  __n = 0;
  local_1f0 = 0;
  local_1f8 = points;
  do {
    uVar12 = ((long)(points->
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(points->
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x18;
    if (uVar12 <= __n) {
      this->m_totalNumBodies = this->m_totalNumBodies + (int)uVar12;
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&flags.super__Bvector_base<std::allocator<bool>_>);
      return;
    }
    if ((local_1c8 == (element_type *)0x0) ||
       (rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](&flags,__n),
       (*rVar14._M_p & rVar14._M_mask) != 0)) {
      iVar10 = selectIngredient(this);
      mat.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      mat.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      iVar11 = (*(this->m_system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable
                 [0x2f])();
      if (iVar11 == 0) {
        std::make_shared<chrono::ChMaterialSurfaceNSC>();
        pMVar2 = (this->m_mixture).
                 super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar10].
                 super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        std::__shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_40,
                   (__shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2> *)&matSMC
                  );
        MixtureIngredient::setMaterialProperties
                  (pMVar2,(shared_ptr<chrono::ChMaterialSurfaceNSC> *)&local_40);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
        std::__shared_ptr<chrono::ChMaterialSurface,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<chrono::ChMaterialSurface,(__gnu_cxx::_Lock_policy)2> *)&mat,
                   (__shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2> *)&matSMC
                  );
LAB_00e385d6:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&matSMC.
                    super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      else if (iVar11 == 1) {
        std::make_shared<chrono::ChMaterialSurfaceSMC>();
        pMVar2 = (this->m_mixture).
                 super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar10].
                 super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        std::__shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_50,
                   (__shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2> *)&matSMC
                  );
        MixtureIngredient::setMaterialProperties
                  (pMVar2,(shared_ptr<chrono::ChMaterialSurfaceSMC> *)&local_50);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
        std::__shared_ptr<chrono::ChMaterialSurface,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<chrono::ChMaterialSurface,(__gnu_cxx::_Lock_policy)2> *)&mat,
                   (__shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2> *)&matSMC
                  );
        goto LAB_00e385d6;
      }
      local_1c0 = __n;
      iVar11 = (*(this->m_system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable
                 [0x30])();
      this_01 = (ChBody *)CONCAT44(extraout_var,iVar11);
      iVar11 = this->m_crtBodyId;
      this->m_crtBodyId = iVar11 + 1;
      (this_01->super_ChPhysicsItem).super_ChObj.m_identifier = iVar11;
      pCVar3 = (local_1f8->
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ChCoordsys<double> *)((long)pCVar3->m_data + local_1f0) !=
          &(this_01->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord) {
        (this_01->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
        m_data[0] = *(double *)((long)pCVar3->m_data + local_1f0);
        (this_01->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
        m_data[1] = *(double *)((long)pCVar3->m_data + local_1f0 + 8);
        (this_01->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
        m_data[2] = *(double *)((long)pCVar3->m_data + local_1f0 + 0x10);
      }
      this_00 = &this_01->super_ChBodyFrame;
      matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&DAT_3ff0000000000000;
      matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ChFrame<double>::SetRot((ChFrame<double> *)this_00,(ChQuaternion<double> *)&matSMC);
      (*(this_00->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[7])(this_00);
      ChBody::SetBodyFixed(this_01,false);
      ChBody::SetCollide(this_01,true);
      MixtureIngredient::getSize
                (&size,(this->m_mixture).
                       super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar10].
                       super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
      local_1e8 = MixtureIngredient::getDensity
                            ((this->m_mixture).
                             super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar10].
                             super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
      gyration.m_data[2] = 0.0;
      gyration.m_data[0] = 0.0;
      gyration.m_data[1] = 0.0;
      MixtureIngredient::calcGeometricProps
                ((this->m_mixture).
                 super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar10].
                 super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,&size,&volume,&gyration);
      dVar9 = volume;
      dVar6 = volume * local_1e8;
      ChVariablesBodyOwnMass::SetBodyMass(&this_01->variables,dVar6);
      matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(dVar6 * gyration.m_data[0]);
      matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(dVar6 * gyration.m_data[1]);
      ChBody::SetInertiaXX(this_01,(ChVector<double> *)&matSMC);
      auVar7._8_8_ = dVar6;
      auVar7._0_8_ = dVar6;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = dVar9;
      auVar7 = vunpcklpd_avx(auVar7,auVar8);
      this->m_totalMass = auVar7._0_8_ + this->m_totalMass;
      this->m_totalVolume = auVar7._8_8_ + this->m_totalVolume;
      std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
                   &matSMC,&(this_01->collision_model).
                            super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  );
      (*((matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         )->super_ChMaterialSurface)._vptr_ChMaterialSurface[3])();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&matSMC.
                  super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      switch(((this->m_mixture).
              super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar10].
              super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->m_type) {
      case SPHERE:
        std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_148,
                   &mat.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
        dVar6 = size.m_data[0];
        matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&DAT_3ff0000000000000;
        bodyPtr.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        bodyPtr.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ChVisualMaterial::Default();
        AddSphereGeometry(this_01,(shared_ptr<chrono::ChMaterialSurface> *)&local_148,dVar6,
                          (ChVector<double> *)&bodyPtr,(ChQuaternion<double> *)&matSMC,true,
                          &local_60);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_60.
                    super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        this_02 = &local_148._M_refcount;
        break;
      case ELLIPSOID:
        std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_158,
                   &mat.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
        matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&DAT_3ff0000000000000;
        bodyPtr.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        bodyPtr.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ChVisualMaterial::Default();
        AddEllipsoidGeometry
                  (this_01,(shared_ptr<chrono::ChMaterialSurface> *)&local_158,&size,
                   (ChVector<double> *)&bodyPtr,(ChQuaternion<double> *)&matSMC,true,&local_70);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_70.
                    super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        this_02 = &local_158._M_refcount;
        break;
      case BOX:
        std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_168,
                   &mat.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
        matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&DAT_3ff0000000000000;
        bodyPtr.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        bodyPtr.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ChVisualMaterial::Default();
        AddBoxGeometry(this_01,(shared_ptr<chrono::ChMaterialSurface> *)&local_168,&size,
                       (ChVector<double> *)&bodyPtr,(ChQuaternion<double> *)&matSMC,true,&local_80);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_80.
                    super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        this_02 = &local_168._M_refcount;
        break;
      case CYLINDER:
        std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_178,
                   &mat.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
        dVar9 = size.m_data[1];
        dVar6 = size.m_data[0];
        matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&DAT_3ff0000000000000;
        bodyPtr.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        bodyPtr.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ChVisualMaterial::Default();
        AddCylinderGeometry(this_01,(shared_ptr<chrono::ChMaterialSurface> *)&local_178,dVar6,dVar9,
                            (ChVector<double> *)&bodyPtr,(ChQuaternion<double> *)&matSMC,true,
                            &local_90);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_90.
                    super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        this_02 = &local_178._M_refcount;
        break;
      case CONE:
        std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_188,
                   &mat.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
        dVar9 = size.m_data[1];
        dVar6 = size.m_data[0];
        matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&DAT_3ff0000000000000;
        bodyPtr.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        bodyPtr.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ChVisualMaterial::Default();
        AddConeGeometry(this_01,(shared_ptr<chrono::ChMaterialSurface> *)&local_188,dVar6,dVar9,
                        (ChVector<double> *)&bodyPtr,(ChQuaternion<double> *)&matSMC,true,&local_a0)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_a0.
                    super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        this_02 = &local_188._M_refcount;
        break;
      case CAPSULE:
        std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_1a8,
                   &mat.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
        dVar9 = size.m_data[1];
        dVar6 = size.m_data[0];
        matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&DAT_3ff0000000000000;
        bodyPtr.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        bodyPtr.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ChVisualMaterial::Default();
        AddCapsuleGeometry(this_01,(shared_ptr<chrono::ChMaterialSurface> *)&local_1a8,dVar6,dVar9,
                           (ChVector<double> *)&bodyPtr,(ChQuaternion<double> *)&matSMC,true,
                           &local_c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_c0.
                    super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        this_02 = &local_1a8._M_refcount;
        break;
      case BISPHERE:
        std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_198,
                   &mat.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
        dVar9 = size.m_data[1];
        dVar6 = size.m_data[0];
        matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&DAT_3ff0000000000000;
        bodyPtr.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        bodyPtr.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ChVisualMaterial::Default();
        AddBiSphereGeometry(this_01,(shared_ptr<chrono::ChMaterialSurface> *)&local_198,dVar6,dVar9,
                            (ChVector<double> *)&bodyPtr,(ChQuaternion<double> *)&matSMC,true,
                            &local_b0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_b0.
                    super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        this_02 = &local_198._M_refcount;
        break;
      case ROUNDEDCYLINDER:
        std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_1b8,
                   &mat.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
        dVar9 = size.m_data[1];
        dVar6 = size.m_data[0];
        matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&DAT_3ff0000000000000;
        local_1e0 = size.m_data[2];
        bodyPtr.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        bodyPtr.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ChVisualMaterial::Default();
        AddRoundedCylinderGeometry
                  (this_01,(shared_ptr<chrono::ChMaterialSurface> *)&local_1b8,dVar6,dVar9,local_1e0
                   ,(ChVector<double> *)&bodyPtr,(ChQuaternion<double> *)&matSMC,true,&local_d0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_d0.
                    super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        this_02 = &local_1b8._M_refcount;
        break;
      default:
        goto switchD_00e387f3_default;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_02);
switchD_00e387f3_default:
      std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
                   &matSMC,&(this_01->collision_model).
                            super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  );
      (*((matSMC.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         )->super_ChMaterialSurface)._vptr_ChMaterialSurface[4])();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&matSMC.
                  super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChBody,void>
                ((__shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2> *)
                 &bodyPtr.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>,this_01);
      pCVar4 = this->m_system;
      std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_e0,&bodyPtr.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
      (*(pCVar4->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x25])
                (pCVar4,&local_e0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
      __n = local_1c0;
      peVar13 = (this->m_mixture).
                super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar10].
                super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      plVar5 = *(long **)&(peVar13->add_body_callback).
                          super___shared_ptr<chrono::utils::MixtureIngredient::AddBodyCallback,_(__gnu_cxx::_Lock_policy)2>
      ;
      if (plVar5 != (long *)0x0) {
        std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_f0,&bodyPtr.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>
                  );
        (**(code **)(*plVar5 + 0x10))(plVar5,&local_f0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
        peVar13 = (this->m_mixture).
                  super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar10].
                  super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
      }
      BodyInfo::BodyInfo((BodyInfo *)&matSMC,peVar13->m_type,local_1e8,&size,&bodyPtr);
      std::
      vector<chrono::utils::Generator::BodyInfo,_std::allocator<chrono::utils::Generator::BodyInfo>_>
      ::emplace_back<chrono::utils::Generator::BodyInfo>(local_1d8,(BodyInfo *)&matSMC);
      points = local_1f8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_208);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&bodyPtr.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mat.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    local_1f0 = local_1f0 + 0x18;
    __n = __n + 1;
  } while( true );
}

Assistant:

void Generator::createObjects(const PointVector& points, const ChVector<>& vel) {
    bool check = false;
    std::vector<bool> flags;
    if (m_callback) {
        flags.resize(points.size(), true);
        m_callback->OnCreateObjects(points, flags);
        check = true;
    }

    for (int i = 0; i < points.size(); i++) {
        if (check && !flags[i])
            continue;

        // Select the type of object to be created.
        int index = selectIngredient();

        // Create a contact material consistent with the associated system and modify it based on attributes of the
        // current ingredient.
        std::shared_ptr<ChMaterialSurface> mat;
        switch (m_system->GetContactMethod()) {
            case ChContactMethod::NSC: {
                auto matNSC = chrono_types::make_shared<ChMaterialSurfaceNSC>();
                m_mixture[index]->setMaterialProperties(matNSC);
                mat = matNSC;
                break;
            }
            case ChContactMethod::SMC: {
                auto matSMC = chrono_types::make_shared<ChMaterialSurfaceSMC>();
                m_mixture[index]->setMaterialProperties(matSMC);
                mat = matSMC;
                break;
            }
        }

        // Create the body (with appropriate collision model, consistent with the associated system)
        ChBody* body = m_system->NewBody();

        // Set identifier
        body->SetIdentifier(m_crtBodyId++);

        // Set position and orientation
        body->SetPos(points[i]);
        body->SetRot(ChQuaternion<>(1, 0, 0, 0));
        body->SetPos_dt(vel);
        body->SetBodyFixed(false);
        body->SetCollide(true);

        // Get size and density; calculate geometric properties
        ChVector<> size = m_mixture[index]->getSize();
        double density = m_mixture[index]->getDensity();
        double volume;
        ChVector<> gyration;
        m_mixture[index]->calcGeometricProps(size, volume, gyration);
        double mass = density * volume;

        // Set mass properties
        body->SetMass(mass);
        body->SetInertiaXX(mass * gyration);
        m_totalMass += mass;
        m_totalVolume += volume;

        // Add collision geometry
        body->GetCollisionModel()->ClearModel();

        switch (m_mixture[index]->m_type) {
            case MixtureType::SPHERE:
                AddSphereGeometry(body, mat, size.x());
                break;
            case MixtureType::ELLIPSOID:
                AddEllipsoidGeometry(body, mat, size);
                break;
            case MixtureType::BOX:
                AddBoxGeometry(body, mat, size);
                break;
            case MixtureType::CYLINDER:
                AddCylinderGeometry(body, mat, size.x(), size.y());
                break;
            case MixtureType::CONE:
                AddConeGeometry(body, mat, size.x(), size.y());
                break;
            case MixtureType::BISPHERE:
            	AddBiSphereGeometry(body, mat, size.x(), size.y());
                break;
            case MixtureType::CAPSULE:
                AddCapsuleGeometry(body, mat, size.x(), size.y());
                break;
            case MixtureType::ROUNDEDCYLINDER:
                AddRoundedCylinderGeometry(body, mat, size.x(), size.y(), size.z());
                break;
        }

        body->GetCollisionModel()->BuildModel();

        // Attach the body to the system and append to list of generated bodies.
        std::shared_ptr<ChBody> bodyPtr(body);

        m_system->AddBody(bodyPtr);

        // If the callback pointer is set, call the function with the body pointer
        if (m_mixture[index]->add_body_callback) {
            m_mixture[index]->add_body_callback->OnAddBody(bodyPtr);
        }

        m_bodies.push_back(BodyInfo(m_mixture[index]->m_type, density, size, bodyPtr));
    }

    m_totalNumBodies += (unsigned int)points.size();
}